

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

void __thiscall CLPIParser::composeSequenceInfo(CLPIParser *this,BitStreamWriter *writer)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  uint8_t *puVar5;
  int beforeCount;
  uint32_t *lengthPos;
  BitStreamWriter *writer_local;
  CLPIParser *this_local;
  
  puVar5 = BitStream::getBuffer(&writer->super_BitStream);
  iVar1 = BitStreamWriter::getBitsCount(writer);
  BitStreamWriter::putBits(writer,0x20,0);
  iVar2 = BitStreamWriter::getBitsCount(writer);
  BitStreamWriter::putBits(writer,8,0);
  BitStreamWriter::putBits(writer,8,1);
  BitStreamWriter::putBits(writer,0x20,0);
  BitStreamWriter::putBits(writer,8,1);
  BitStreamWriter::putBits(writer,8,0);
  BitStreamWriter::putBits(writer,0x10,0x1001);
  BitStreamWriter::putBits(writer,0x20,0);
  BitStreamWriter::putBits(writer,0x20,this->presentation_start_time);
  BitStreamWriter::putBits(writer,0x20,this->presentation_end_time);
  iVar3 = BitStreamWriter::getBitsCount(writer);
  uVar4 = my_ntohl(iVar3 / 8 - iVar2 / 8);
  *(uint32_t *)(puVar5 + iVar1 / 8) = uVar4;
  return;
}

Assistant:

void CLPIParser::composeSequenceInfo(BitStreamWriter& writer) const
{
    const auto lengthPos = reinterpret_cast<uint32_t*>(writer.getBuffer() + writer.getBitsCount() / 8);
    writer.putBits(32, 0);  // length
    const int beforeCount = writer.getBitsCount() / 8;

    writer.putBits(8, 0);  // reserved_for_word_align
    writer.putBits(8, 1);  // number_of_ATC_sequences
    // for (int atc_id = 0; atc_id < number_of_ATC_sequences; atc_id++)
    {
        writer.putBits(32, 0);  // SPN_ATC_start
        writer.putBits(8, 1);   // number_of_STC_sequences
        writer.putBits(8, 0);   // offset_STC_id
        // for (int stc_id=offset_STC_id; stc_id < number_of_STC_sequences + offset_STC_id; stc_id++)
        {
            writer.putBits(16, DEFAULT_PCR_PID);
            writer.putBits(32, 0);  // SPN_STC_start
            writer.putBits(32, presentation_start_time);
            writer.putBits(32, presentation_end_time);
        }
    }
    *lengthPos = my_htonl(writer.getBitsCount() / 8 - beforeCount);
}